

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O0

void __thiscall
google::protobuf::(anonymous_namespace)::FeatureUnboundedTypeTest_CompileDefaults_Test::
~FeatureUnboundedTypeTest_CompileDefaults_Test(FeatureUnboundedTypeTest_CompileDefaults_Test *this)

{
  protobuf::anon_unknown_0::FeatureUnboundedTypeTest_CompileDefaults_Test::
  ~FeatureUnboundedTypeTest_CompileDefaults_Test
            ((FeatureUnboundedTypeTest_CompileDefaults_Test *)(this + -0x1c0));
  return;
}

Assistant:

TEST_P(FeatureUnboundedTypeTest, CompileDefaults) {
  const FileDescriptor* file = ParseSchema(absl::Substitute(R"schema(
    syntax = "proto2";
    package test;
    import "google/protobuf/descriptor.proto";

    extend google.protobuf.FeatureSet {
      optional Foo bar = 9999;
    }
    message SomeMessage {
      optional bool value = 1;
    }
    message Foo {
      optional $0 field_feature = 12 [
        targets = TARGET_TYPE_FIELD,
        feature_support.edition_introduced = EDITION_2023,
        edition_defaults = { edition: EDITION_LEGACY, value: "1" }
      ];
    }
  )schema",
                                                            GetParam()));
  ASSERT_NE(file, nullptr);

  const FieldDescriptor* ext = file->extension(0);
  EXPECT_THAT(
      FeatureResolver::CompileDefaults(feature_set_, {ext}, EDITION_1_TEST_ONLY,
                                       EDITION_99997_TEST_ONLY),
      HasError(HasSubstr("is not an enum or boolean")));
}